

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O2

HaI32 QuickSortVertices(HaF64 *vertList,HaI32 stride,HaI32 compareCount,HaI32 vertexCount,
                       HaF64 tolerance)

{
  long lVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 (*pauVar6) [16];
  HaI32 HVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int vertexCount_00;
  undefined4 in_register_00000034;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  HaF64 *pHVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar32 [16];
  
  if (vertexCount < 0x18001) {
    HVar7 = SortVertices(vertList,stride,compareCount,vertexCount,tolerance);
    return HVar7;
  }
  lVar9 = (long)stride;
  auVar24 = ZEXT816(0) << 0x40;
  auVar25 = ZEXT816(0) << 0x40;
  dVar27 = 0.0;
  auVar28 = ZEXT816(0) << 0x40;
  lVar1 = lVar9 * 8;
  pauVar10 = (undefined1 (*) [16])(vertList + 3);
  uVar13 = (ulong)(uint)vertexCount;
  while( true ) {
    bVar23 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    dVar26 = auVar28._0_8_;
    dVar2 = auVar28._8_8_;
    if (bVar23) break;
    pauVar6 = pauVar10 + -1;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(double *)(*pauVar6 + 8);
    auVar31 = *pauVar10;
    pauVar10 = (undefined1 (*) [16])(*pauVar10 + lVar1);
    dVar27 = dVar27 + *(double *)(*pauVar6 + 8);
    auVar28._0_8_ = dVar26 + auVar31._0_8_;
    auVar28._8_8_ = dVar2 + auVar31._8_8_;
    auVar25 = vfmadd231sd_fma(auVar25,auVar29,auVar29);
    auVar24 = vfmadd231pd_fma(auVar24,auVar31,auVar31);
  }
  auVar30._0_8_ = (double)vertexCount;
  auVar30._8_8_ = in_XMM6_Qa;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar27 * dVar27;
  auVar31 = vfmsub213sd_fma(auVar25,auVar30,auVar31);
  auVar25._0_8_ = dVar26 * dVar26;
  auVar25._8_8_ = dVar2 * dVar2;
  auVar32._8_8_ = auVar30._0_8_;
  auVar32._0_8_ = auVar30._0_8_;
  auVar25 = vfmsub213pd_fma(auVar24,auVar32,auVar25);
  auVar24 = vshufpd_avx(auVar25,auVar25,1);
  uVar3 = vcmppd_avx512vl(auVar24,auVar25,1);
  uVar13 = vcmppd_avx512vl(auVar31,auVar25,1);
  uVar13 = ((byte)uVar3 & 3) & uVar13;
  bVar5 = (byte)uVar13;
  uVar3 = vcmppd_avx512vl(auVar31,auVar24,1);
  uVar4 = vcmppd_avx512vl(auVar25,auVar24,1);
  auVar24 = vshufpd_avx(auVar28,auVar28,1);
  bVar23 = (bool)((byte)uVar3 & 3 & (byte)uVar4 & 1);
  iVar11 = vertexCount + -1;
  dVar27 = (double)((ulong)bVar23 * auVar24._0_8_ +
                   (ulong)!bVar23 *
                   ((ulong)(bVar5 & 1) * (long)dVar26 + (ulong)!(bool)(bVar5 & 1) * (long)dVar27)) /
           auVar30._0_8_;
  uVar15 = 4;
  if (bVar23 == false) {
    uVar15 = (ulong)((uint)uVar13 & 1 | 2);
  }
  vertexCount_00 = 0;
  do {
    lVar17 = (long)vertexCount_00;
    lVar20 = lVar17 + -1;
    lVar18 = (lVar17 * 8 + 0x7fffffff8) * lVar9;
    pdVar16 = (double *)((long)vertList + lVar1 * lVar17 + uVar15 * 8);
    iVar19 = vertexCount_00;
    do {
      vertexCount_00 = iVar19;
      lVar20 = lVar20 + 1;
      iVar19 = vertexCount_00 + 1;
      lVar18 = lVar18 + CONCAT44(in_register_00000034,stride) * 8;
      dVar2 = *pdVar16;
      pdVar16 = pdVar16 + lVar9;
    } while (dVar2 < dVar27);
    lVar14 = (long)iVar11;
    lVar17 = lVar14 + 1;
    lVar21 = (lVar14 * 8 + 8) * lVar9;
    pdVar16 = (double *)((long)vertList + lVar1 * lVar14 + uVar15 * 8);
    iVar12 = iVar11;
    do {
      iVar11 = iVar12;
      dVar2 = *pdVar16;
      lVar17 = lVar17 + -1;
      iVar12 = iVar11 + -1;
      pdVar16 = pdVar16 + -lVar9;
      lVar21 = lVar21 + CONCAT44(in_register_00000034,stride) * -8;
    } while (dVar27 < dVar2);
    if (lVar20 <= lVar17) {
      lVar17 = lVar21 * 0x20000000 >> 0x1d;
      lVar20 = lVar18 * 0x20000000 >> 0x1d;
      for (uVar13 = 0; iVar11 = iVar12, vertexCount_00 = iVar19,
          (uint)(~(stride >> 0x1f) & stride) != uVar13; uVar13 = uVar13 + 1) {
        uVar3 = *(undefined8 *)((long)vertList + uVar13 * 8 + lVar20);
        *(undefined8 *)((long)vertList + uVar13 * 8 + lVar20) =
             *(undefined8 *)((long)vertList + uVar13 * 8 + lVar17);
        *(undefined8 *)((long)vertList + uVar13 * 8 + lVar17) = uVar3;
      }
    }
  } while (vertexCount_00 <= iVar11);
  if (vertexCount - vertexCount_00 == 0 || vertexCount < vertexCount_00) {
    __assert_fail("i0 < vertexCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x133,
                  "hacd::HaI32 QuickSortVertices(hacd::HaF64 *const, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaF64)"
                 );
  }
  HVar7 = QuickSortVertices(vertList,stride,compareCount,vertexCount_00,tolerance);
  uVar8 = QuickSortVertices(vertList + vertexCount_00 * stride,stride,compareCount,
                            vertexCount - vertexCount_00,tolerance);
  pHVar22 = vertList + 2;
  lVar20 = (long)vertexCount_00;
  uVar13 = (ulong)(~((int)uVar8 >> 0x1f) & uVar8);
  while (bVar23 = uVar13 != 0, uVar13 = uVar13 - 1, bVar23) {
    memcpy(pHVar22 + HVar7 * lVar9,(HaF64 *)((long)pHVar22 + lVar1 * lVar20),
           (ulong)(stride - 2) << 3);
    pHVar22 = pHVar22 + lVar9;
  }
  pdVar16 = (double *)((long)vertList + lVar1 * lVar20);
  for (; lVar20 < (long)(ulong)(uint)vertexCount; lVar20 = lVar20 + 1) {
    *pdVar16 = (double)HVar7 + *pdVar16;
    pdVar16 = pdVar16 + lVar9;
  }
  return uVar8 + HVar7;
}

Assistant:

static hacd::HaI32 QuickSortVertices (hacd::HaF64* const vertList, hacd::HaI32 stride, hacd::HaI32 compareCount, hacd::HaI32 vertexCount, hacd::HaF64 tolerance)
	{
		hacd::HaI32 count = 0;
		if (vertexCount > (3 * 1024 * 32)) {
		hacd::HaF64 x = hacd::HaF32 (0.0f);
		hacd::HaF64 y = hacd::HaF32 (0.0f);
		hacd::HaF64 z = hacd::HaF32 (0.0f);
		hacd::HaF64 xd = hacd::HaF32 (0.0f);
		hacd::HaF64 yd = hacd::HaF32 (0.0f);
		hacd::HaF64 zd = hacd::HaF32 (0.0f);
			
			for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
			hacd::HaF64 x0 = vertList[i * stride + 2];
			hacd::HaF64 y0 = vertList[i * stride + 3];
			hacd::HaF64 z0 = vertList[i * stride + 4];
				x += x0;
				y += y0;
				z += z0;
				xd += x0 * x0;
				yd += y0 * y0;
				zd += z0 * z0;
			}

			xd = vertexCount * xd - x * x;
			yd = vertexCount * yd - y * y;
			zd = vertexCount * zd - z * z;

			hacd::HaI32 axis = 2;
		        hacd::HaF64 axisVal = x / vertexCount;
			if ((yd > xd) && (yd > zd)) {
				axis = 3;
				axisVal = y / vertexCount;
			}
			if ((zd > xd) && (zd > yd)) {
				axis = 4;
				axisVal = z / vertexCount;
			}

			hacd::HaI32 i0 = 0;
			hacd::HaI32 i1 = vertexCount - 1;
			do {    
				for ( ;vertList[i0 * stride + axis] < axisVal; i0 ++); 
				for ( ;vertList[i1 * stride + axis] > axisVal; i1 --);
				if (i0 <= i1) {
					for (hacd::HaI32 i = 0; i < stride; i ++) {
						Swap (vertList[i0 * stride + i], vertList[i1 * stride + i]);
					}
					i0 ++; 
					i1 --;
				}
			} while (i0 <= i1);
			HACD_ASSERT (i0 < vertexCount);

		hacd::HaI32 count0 = QuickSortVertices (&vertList[ 0 * stride], stride, compareCount, i0, tolerance);
		hacd::HaI32 count1 = QuickSortVertices (&vertList[i0 * stride], stride, compareCount, vertexCount - i0, tolerance);
			
			count = count0 + count1;

			for (hacd::HaI32 i = 0; i < count1; i ++) {
			memcpy (&vertList[(count0 + i) * stride + 2], &vertList[(i0 + i) * stride + 2], (stride - 2) * sizeof (hacd::HaF64));
			}


//		hacd::HaF64* const indexPtr = (hacd::HaI64*)vertList;
			for (hacd::HaI32 i = i0; i < vertexCount; i ++) {
//			indexPtr[i * stride] += count0;
			vertList[i * stride] += hacd::HaF64 (count0);
			}

		} else {
		count = SortVertices (vertList, stride, compareCount, vertexCount, tolerance);
		}

		return count;
	}